

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

void __thiscall libwebvtt::LineReader::~LineReader(LineReader *this)

{
  code *pcVar1;
  LineReader *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int LineReader::GetLine(std::string* line_ptr) {
  if (line_ptr == NULL)
    return -1;

  std::string& ln = *line_ptr;
  ln.clear();

  // Consume characters from the stream, until we
  // reach end-of-line (or end-of-stream).

  // The WebVTT spec states that lines may be
  // terminated in any of these three ways:
  //  LF
  //  CR
  //  CR LF

  // We interrogate each character as we read it from the stream.
  // If we detect an end-of-line character, we consume the full
  // end-of-line indication, and we're done; otherwise, accumulate
  // the character and repeat.

  for (;;) {
    char c;
    const int e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return (ln.empty()) ? 1 : 0;

    // We have a character, so we must first determine
    // whether we have reached end-of-line.

    if (c == kLF)
      return 0;  // handle the easy end-of-line case immediately

    if (c == kCR)
      break;  // handle the hard end-of-line case outside of loop

    if (c == '\xFE' || c == '\xFF')  // not UTF-8
      return -1;

    // To defend against pathological or malicious streams, we
    // cap the line length at some arbitrarily-large value:
    enum { kMaxLineLength = 10000 };  // arbitrary

    if (ln.length() >= kMaxLineLength)
      return -1;

    // We don't have an end-of-line character, so accumulate
    // the character in our line buffer.
    ln.push_back(c);
  }

  // We detected a CR.  We must interrogate the next character
  // in the stream, to determine whether we have a LF (which
  // would make it part of this same line).

  char c;
  const int e = GetChar(&c);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;

  // If next character in the stream is not a LF, return it
  // to the stream (because it's part of the next line).
  if (c != kLF)
    UngetChar(c);

  return 0;
}